

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,str_writer<wchar_t> *f)

{
  void *__dest;
  size_t sVar1;
  wchar_t wVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  wchar_t __tmp;
  wchar_t *__src;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  basic_buffer<wchar_t> *c;
  
  uVar9 = (ulong)spec->width_;
  uVar3 = f->size_;
  puVar4 = *(undefined8 **)this;
  lVar8 = puVar4[2];
  uVar12 = uVar9 - uVar3;
  if (uVar9 < uVar3 || uVar12 == 0) {
    if ((ulong)puVar4[3] < uVar3 + lVar8) {
      (**(code **)*puVar4)(puVar4);
    }
    puVar4[2] = uVar3 + lVar8;
    sVar6 = f->size_;
    if (sVar6 != 0) {
      pvVar10 = (void *)(lVar8 * 4 + puVar4[1]);
      __src = f->s;
LAB_00202ee2:
      memmove(pvVar10,__src,sVar6 << 2);
      return;
    }
  }
  else {
    uVar11 = lVar8 + uVar9;
    if ((ulong)puVar4[3] < uVar11) {
      (**(code **)*puVar4)(puVar4,uVar11);
    }
    puVar4[2] = uVar11;
    lVar5 = puVar4[1];
    __dest = (void *)(lVar5 + lVar8 * 4);
    wVar2 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar11 = uVar12 >> 1;
      pvVar10 = __dest;
      if (1 < uVar12) {
        pvVar10 = (void *)((long)__dest + uVar11 * 4);
        lVar8 = 0;
        do {
          *(wchar_t *)((long)__dest + lVar8) = wVar2;
          lVar8 = lVar8 + 4;
        } while (uVar11 * 4 - lVar8 != 0);
      }
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(pvVar10,f->s,sVar1);
      }
      if (uVar9 != uVar3) {
        lVar8 = 0;
        do {
          *(wchar_t *)((long)pvVar10 + lVar8 + sVar1) = wVar2;
          lVar8 = lVar8 + 4;
        } while (uVar9 * 4 + (uVar3 + uVar11) * -4 != lVar8);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pvVar10 = __dest;
      if (uVar9 != uVar3) {
        pvVar10 = (void *)((long)__dest + uVar12 * 4);
        lVar8 = 0;
        do {
          *(wchar_t *)((long)__dest + lVar8) = wVar2;
          lVar8 = lVar8 + 4;
        } while (uVar9 * 4 + uVar3 * -4 != lVar8);
      }
      sVar6 = f->size_;
      if (sVar6 != 0) {
        __src = f->s;
        goto LAB_00202ee2;
      }
    }
    else {
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(__dest,f->s,sVar1);
      }
      if (uVar9 != uVar3) {
        lVar7 = 0;
        do {
          *(wchar_t *)(lVar5 + lVar8 * 4 + sVar1 + lVar7) = wVar2;
          lVar7 = lVar7 + 4;
        } while (uVar9 * 4 + uVar3 * -4 != lVar7);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }